

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

void __thiscall
icu_63::CollationDataBuilder::optimize
          (CollationDataBuilder *this,UnicodeSet *set,UErrorCode *errorCode)

{
  CollationData *this_00;
  UBool UVar1;
  UChar32 c_00;
  uint32_t uVar2;
  bool bVar3;
  uint32_t ce32;
  UChar32 c;
  undefined1 local_60 [8];
  UnicodeSetIterator iter;
  UErrorCode *errorCode_local;
  UnicodeSet *set_local;
  CollationDataBuilder *this_local;
  
  iter.cpString = (UnicodeString *)errorCode;
  UVar1 = ::U_FAILURE(*errorCode);
  if ((UVar1 == '\0') && (UVar1 = UnicodeSet::isEmpty(set), UVar1 == '\0')) {
    UnicodeSetIterator::UnicodeSetIterator((UnicodeSetIterator *)local_60,set);
    while( true ) {
      UVar1 = UnicodeSetIterator::next((UnicodeSetIterator *)local_60);
      bVar3 = false;
      if (UVar1 != '\0') {
        UVar1 = UnicodeSetIterator::isString((UnicodeSetIterator *)local_60);
        bVar3 = UVar1 == '\0';
      }
      if (!bVar3) break;
      c_00 = UnicodeSetIterator::getCodepoint((UnicodeSetIterator *)local_60);
      uVar2 = utrie2_get32_63(this->trie,c_00);
      if (uVar2 == 0xc0) {
        this_00 = this->base;
        uVar2 = CollationData::getCE32(this_00,c_00);
        uVar2 = CollationData::getFinalCE32(this_00,uVar2);
        uVar2 = copyFromBaseCE32(this,c_00,uVar2,'\x01',(UErrorCode *)iter.cpString);
        utrie2_set32_63(this->trie,c_00,uVar2,(UErrorCode *)iter.cpString);
      }
    }
    this->modified = '\x01';
    UnicodeSetIterator::~UnicodeSetIterator((UnicodeSetIterator *)local_60);
  }
  return;
}

Assistant:

void
CollationDataBuilder::optimize(const UnicodeSet &set, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode) || set.isEmpty()) { return; }
    UnicodeSetIterator iter(set);
    while(iter.next() && !iter.isString()) {
        UChar32 c = iter.getCodepoint();
        uint32_t ce32 = utrie2_get32(trie, c);
        if(ce32 == Collation::FALLBACK_CE32) {
            ce32 = base->getFinalCE32(base->getCE32(c));
            ce32 = copyFromBaseCE32(c, ce32, TRUE, errorCode);
            utrie2_set32(trie, c, ce32, &errorCode);
        }
    }
    modified = TRUE;
}